

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS_linux_common.cpp
# Opt level: O1

bool __thiscall
OS::Services_Common::GetControl(Services_Common *this,string *name,void *pValue,size_t size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined *puVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *pStr;
  string *psVar9;
  string fileName;
  allocator local_59;
  string local_58;
  size_t local_38;
  
  std::__cxx11::string::string((string *)&local_58,ENV_PREFIX,&local_59);
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)(name->_M_dataplus)._M_p);
  pcVar7 = getenv(local_58._M_dataplus._M_p);
  if (size == 4 && pcVar7 != (char *)0x0) {
    iVar6 = atoi(pcVar7);
    *(int *)pValue = iVar6;
  }
  else {
    bVar2 = true;
    if (pcVar7 == (char *)0x0) goto LAB_00106b44;
    sVar8 = strlen(pcVar7);
    if (size <= sVar8) goto LAB_00106b44;
    strcpy((char *)pValue,pcVar7);
  }
  bVar2 = false;
LAB_00106b44:
  paVar1 = &local_58.field_2;
  local_38 = size;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  bVar5 = true;
  if (bVar2) {
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    pcVar7 = getenv("HOME");
    if (pcVar7 == (char *)0x0) {
      bVar5 = false;
    }
    else {
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)pcVar7);
      std::__cxx11::string::append((char *)&local_58);
      psVar9 = &local_58;
      std::__cxx11::string::append((char *)psVar9);
      bVar5 = GetControlFromFile((Services_Common *)psVar9,&local_58,name,pValue,local_38);
    }
    sVar4 = local_58._M_string_length;
    puVar3 = SYSTEM_DIR;
    if (bVar5 == false) {
      strlen(SYSTEM_DIR);
      std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)sVar4,(ulong)puVar3);
      std::__cxx11::string::append((char *)&local_58);
      psVar9 = &local_58;
      std::__cxx11::string::append((char *)psVar9);
      bVar5 = GetControlFromFile((Services_Common *)psVar9,&local_58,name,pValue,local_38);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return bVar5;
}

Assistant:

bool Services_Common::GetControl(
    const std::string& name,
    void* pValue,
    size_t size ) const
{
    // Look at environment variables first:
    {
        std::string envName(ENV_PREFIX);
        envName += name;
        const char *envVal = getenv(envName.c_str());
        if( ( envVal != NULL ) && ( size == sizeof(unsigned int) ) )
        {
            unsigned int *puVal = (unsigned int *)pValue;
            *puVal = atoi(envVal);
            return true;
        }
        else if( ( envVal != NULL ) && ( strlen(envVal) < size ) )
        {
            char* pStr = (char*)pValue;
            strcpy( pStr, envVal );
            return true;
        }
    }

    // Look at config files second:
    bool    found = false;
    std::string fileName;

    // First, check for a config file in the HOME directory.
    const char *envVal = getenv("HOME");
    if( !found && envVal != NULL )
    {
        fileName = envVal;
        fileName += "/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }

#ifdef __ANDROID__
    // On Android, check the sdcard directory next.
    if( !found )
    {
        fileName = "/sdcard/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }
#endif

    // Finally, check the "system" directory.
    if( !found )
    {
        fileName = SYSTEM_DIR;
        fileName += "/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }

    return found;
}